

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall optimization::common_expr_del::BlockNodes::~BlockNodes(BlockNodes *this)

{
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
            (&(this->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::_Select1st<std::pair<const_unsigned_int,_bool>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::~_Rb_tree(&(this->added)._M_t);
  std::
  _Rb_tree<optimization::common_expr_del::Node,_std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>,_std::_Select1st<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
  ::~_Rb_tree(&(this->node_map)._M_t);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  ::~_Rb_tree(&(this->var_map)._M_t);
  std::
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  ::~vector(&this->nodes);
  return;
}

Assistant:

~BlockNodes() {}